

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.cc
# Opt level: O3

int video_to_image(char *video_name,char *dir_name)

{
  Size *pSVar1;
  uint __val;
  uint uVar2;
  char cVar3;
  uint uVar4;
  long *plVar5;
  ulong uVar6;
  long *plVar7;
  undefined8 uVar8;
  int iVar9;
  uint __len;
  string img_path;
  string __str;
  VideoCapture cap;
  Mat img;
  uint local_14c;
  long *local_148;
  Mat *local_140;
  long local_138;
  long lStack_130;
  _InputArray local_128;
  long lStack_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  ulong *local_e8;
  long local_e0;
  ulong local_d8 [2];
  char *local_c8;
  _OutputArray local_c0 [2];
  Mat local_90 [96];
  
  local_c8 = dir_name;
  cv::Mat::Mat(local_90);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,video_name,(allocator<char> *)&local_128);
  cv::VideoCapture::VideoCapture((VideoCapture *)local_c0,(string *)&local_148,0);
  if (local_148 != &local_138) {
    operator_delete(local_148,local_138 + 1);
  }
  cVar3 = cv::VideoCapture::isOpened();
  if (cVar3 == '\0') {
    perror("Open video file failed!\n");
  }
  iVar9 = 0;
  local_14c = 0;
  do {
    local_138 = 0;
    local_148 = (long *)CONCAT44(local_148._4_4_,0x2010000);
    local_140 = local_90;
    cv::VideoCapture::read(local_c0);
    cVar3 = cv::Mat::empty();
    if (((uint)(iVar9 * -0x33333333) >> 2 | iVar9 * 0x40000000) < 0xccccccd) {
      std::operator+(&local_108,local_c8,&forward_slash_abi_cxx11_);
      local_14c = local_14c + 1;
      __val = -local_14c;
      if (0 < (int)local_14c) {
        __val = local_14c;
      }
      __len = 1;
      if (9 < __val) {
        uVar6 = (ulong)__val;
        uVar2 = 4;
        do {
          __len = uVar2;
          uVar4 = (uint)uVar6;
          if (uVar4 < 100) {
            __len = __len - 2;
            goto LAB_0010520f;
          }
          if (uVar4 < 1000) {
            __len = __len - 1;
            goto LAB_0010520f;
          }
          if (uVar4 < 10000) goto LAB_0010520f;
          uVar6 = uVar6 / 10000;
          uVar2 = __len + 4;
        } while (99999 < uVar4);
        __len = __len + 1;
      }
LAB_0010520f:
      local_e8 = local_d8;
      std::__cxx11::string::_M_construct
                ((ulong)&local_e8,(char)__len - (char)((int)local_14c >> 0x1f));
      std::__detail::__to_chars_10_impl<unsigned_int>
                ((char *)((ulong)(local_14c >> 0x1f) + (long)local_e8),__len,__val);
      uVar8 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p != &local_108.field_2) {
        uVar8 = local_108.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar8 < local_e0 + local_108._M_string_length) {
        uVar6 = 0xf;
        if (local_e8 != local_d8) {
          uVar6 = local_d8[0];
        }
        if (uVar6 < local_e0 + local_108._M_string_length) goto LAB_001052ae;
        plVar5 = (long *)std::__cxx11::string::replace
                                   ((ulong)&local_e8,0,(char *)0x0,(ulong)local_108._M_dataplus._M_p
                                   );
      }
      else {
LAB_001052ae:
        plVar5 = (long *)std::__cxx11::string::_M_append((char *)&local_108,(ulong)local_e8);
      }
      pSVar1 = (Size *)(plVar5 + 2);
      if ((Size *)*plVar5 == pSVar1) {
        local_128.sz = *pSVar1;
        lStack_110 = plVar5[3];
        local_128._0_8_ = &local_128.sz;
      }
      else {
        local_128.sz = *pSVar1;
        local_128._0_8_ = (Size *)*plVar5;
      }
      local_128.obj = (void *)plVar5[1];
      *plVar5 = (long)pSVar1;
      plVar5[1] = 0;
      *(undefined1 *)&pSVar1->width = 0;
      plVar5 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_128,(ulong)suffix_png_abi_cxx11_._M_dataplus._M_p);
      plVar7 = plVar5 + 2;
      if ((long *)*plVar5 == plVar7) {
        local_138 = *plVar7;
        lStack_130 = plVar5[3];
        local_148 = &local_138;
      }
      else {
        local_138 = *plVar7;
        local_148 = (long *)*plVar5;
      }
      local_140 = (Mat *)plVar5[1];
      *plVar5 = (long)plVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      if ((Size *)local_128._0_8_ != &local_128.sz) {
        operator_delete((void *)local_128._0_8_,(ulong)((long)local_128.sz + 1));
      }
      if (local_e8 != local_d8) {
        operator_delete(local_e8,local_d8[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p != &local_108.field_2) {
        operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
      }
      local_128.sz.width = 0;
      local_128.sz.height = 0;
      local_128.flags = 0x1010000;
      local_108.field_2._M_allocated_capacity = 0;
      local_108._M_dataplus._M_p = (pointer)0x0;
      local_108._M_string_length = 0;
      local_128.obj = local_90;
      cv::imwrite((string *)&local_148,&local_128,(vector *)&local_108);
      if (local_108._M_dataplus._M_p != (pointer)0x0) {
        operator_delete(local_108._M_dataplus._M_p,
                        local_108.field_2._M_allocated_capacity - (long)local_108._M_dataplus._M_p);
      }
      if (local_148 != &local_138) {
        operator_delete(local_148,local_138 + 1);
      }
    }
    iVar9 = iVar9 + 1;
    if (cVar3 != '\0') {
      cv::VideoCapture::release();
      cv::VideoCapture::~VideoCapture((VideoCapture *)local_c0);
      cv::Mat::~Mat(local_90);
      return 0;
    }
  } while( true );
}

Assistant:

int video_to_image(const char *video_name, const char *dir_name) {
  int frame_cnt = 0;
  int num = 0;
  Mat img;

  VideoCapture cap(video_name);
  if (!cap.isOpened()) perror("Open video file failed!\n");

  bool flag = true;
  while (flag) {
    bool success = cap.read(img);
    if (img.empty()) flag = false;

    if (frame_cnt % 20 == 0) {
      ++num;
      string img_path = dir_name + forward_slash + to_string(num) + suffix_png;
      imwrite(img_path, img);
    }
    ++frame_cnt;
  }
  cap.release();
  return 0;
}